

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_next
          (basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  parse_state pVar1;
  int iVar2;
  char_type *pcVar3;
  char_type *pcVar4;
  char cVar5;
  span<const_char,_18446744073709551615UL> sVar6;
  
  this_00 = &this->parser_;
  basic_json_parser<char,_std::allocator<char>_>::reset(this_00);
  do {
    if ((this->parser_).more_ != true) goto LAB_0038629d;
    if ((this->parser_).input_ptr_ == (this->parser_).end_input_) {
      sVar6 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar4 = sVar6.data_;
      iVar2 = ec->_M_value;
      if (sVar6.size_ != 0 && iVar2 == 0) {
        (this->parser_).begin_input_ = pcVar4;
        (this->parser_).end_input_ = pcVar4 + sVar6.size_;
        (this->parser_).input_ptr_ = pcVar4;
      }
      if (iVar2 != 0) {
        return;
      }
    }
    pcVar4 = (this->parser_).input_ptr_;
    pcVar3 = (this->parser_).end_input_;
    basic_json_parser<char,_std::allocator<char>_>::parse_some_(this_00,this->visitor_,ec);
    cVar5 = ec->_M_value != 0;
    if (pcVar4 == pcVar3 && !(bool)cVar5) {
      pVar1 = (this->parser_).state_;
      cVar5 = '\x03';
      if (pVar1 != start) {
        cVar5 = '\0';
        if ((pVar1 != accept) && (cVar5 = '\0', ((this->parser_).done_ & 1U) == 0)) {
          cVar5 = '\x01';
          std::error_code::operator=(ec,unexpected_eof);
        }
      }
    }
  } while (cVar5 == '\0');
  if (cVar5 != '\x01') {
LAB_0038629d:
    basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
    do {
      if ((this->source_).source_.current_ == (this->source_).source_.end_) {
        return;
      }
      basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
      if ((this->parser_).input_ptr_ != (this->parser_).end_input_) {
        return;
      }
      sVar6 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar4 = sVar6.data_;
      iVar2 = ec->_M_value;
      if (sVar6.size_ != 0 && iVar2 == 0) {
        (this->parser_).begin_input_ = pcVar4;
        (this->parser_).end_input_ = pcVar4 + sVar6.size_;
        (this->parser_).input_ptr_ = pcVar4;
      }
    } while (iVar2 == 0);
  }
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }        
            parser_.reset();
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                bool eof = parser_.source_exhausted();
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                if (eof)
                {
                    if (parser_.enter())
                    {
                        break;
                    }
                    else if (!parser_.accept())
                    {
                        ec = json_errc::unexpected_eof;
                        return;
                    }
                }
            }
            
            parser_.skip_whitespace();
            while (!source_.eof())
            {
                parser_.skip_whitespace();
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                else
                {
                    break;
                }
            }
        }